

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Menu.c
# Opt level: O0

int menu_screen(tgestate_t *state)

{
  char cVar1;
  char cVar2;
  int iVar3;
  tgestate_t *in_RDI;
  int to_emit;
  uint8_t bit;
  uint8_t Cdash;
  uint8_t Bdash;
  uint8_t C;
  uint8_t B;
  uint8_t speaker1;
  uint8_t speaker0;
  uint16_t channel1_index;
  uint16_t channel0_index;
  uint8_t minor_delay;
  uint8_t major_delay;
  uint8_t datum;
  uint16_t frequency_1;
  uint16_t frequency_0;
  uint16_t counter_1;
  uint16_t counter_0;
  int menu_keys_state;
  tgestate_t *in_stack_ffffffffffffffc8;
  int local_30;
  byte local_2b;
  undefined2 local_2a;
  undefined2 local_28;
  byte local_26;
  byte local_25;
  ushort local_24;
  ushort local_22;
  char local_1f;
  char local_1e;
  uint8_t local_1d;
  uint16_t local_1c;
  uint16_t local_1a;
  uint16_t local_18;
  uint16_t local_16;
  int local_14;
  int local_4;
  
  local_2b = 0;
  (*in_RDI->speccy->stamp)(in_RDI->speccy);
  local_14 = check_menu_keys(in_stack_ffffffffffffffc8);
  local_4 = local_14;
  if ((-1 < local_14) && (local_14 < 2)) {
    wave_morale_flag(in_RDI);
    local_22 = in_RDI->music_channel0_index + 1;
    while( true ) {
      in_RDI->music_channel0_index = local_22;
      local_1d = "\x13"[local_22];
      if (local_1d != 0xff) break;
      local_22 = 0;
    }
    local_1a = frequency_for_semitone(local_1d,&local_25);
    local_24 = in_RDI->music_channel1_index + 1;
    while( true ) {
      in_RDI->music_channel1_index = local_24;
      local_1d = "\n"[local_24];
      if (local_1d != 0xff) break;
      local_24 = 0;
    }
    local_16 = local_1a;
    local_18 = frequency_for_semitone(local_1d,&local_26);
    if ((int)(uint)local_18 >> 8 == 0xff) {
      local_18 = local_16;
    }
    local_1e = '\x18';
    local_1c = local_18;
    do {
      local_1f = -1;
      do {
        local_30 = 3;
        cVar2 = (char)local_16;
        cVar1 = (char)(local_16 >> 8) + -1;
        if ((cVar1 == '\0') && (cVar2 = cVar2 + -1, cVar2 == '\0')) {
          local_25 = local_25 ^ 0x10;
          local_2b = local_25 & 0x10;
          (*in_RDI->speccy->out)(in_RDI->speccy,0xfe,local_25);
          local_30 = 2;
          local_16 = local_1a;
        }
        else {
          local_28 = CONCAT11(cVar1,cVar2);
          local_16 = local_28;
        }
        cVar2 = (char)local_18;
        cVar1 = (char)(local_18 >> 8) + -1;
        if ((cVar1 == '\0') && (cVar2 = cVar2 + -1, cVar2 == '\0')) {
          local_26 = local_26 ^ 0x10;
          local_2b = local_26 & 0x10;
          (*in_RDI->speccy->out)(in_RDI->speccy,0xfe,local_26);
          local_30 = local_30 + -1;
          local_18 = local_1c;
        }
        else {
          local_2a = CONCAT11(cVar1,cVar2);
          local_18 = local_2a;
        }
        while (0 < local_30) {
          (*in_RDI->speccy->out)(in_RDI->speccy,0xfe,local_2b);
          local_30 = local_30 + -1;
        }
        local_1f = local_1f + -1;
      } while (local_1f != '\0');
      local_1e = local_1e + -1;
    } while (local_1e != '\0');
    iVar3 = (*in_RDI->speccy->sleep)(in_RDI->speccy,0x4954d);
    if (iVar3 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int menu_screen(tgestate_t *state)
{
  int      menu_keys_state;
  uint16_t counter_0;       /* was BC */
  uint16_t counter_1;       /* was BC' */
  uint16_t frequency_0;     /* was DE */
  uint16_t frequency_1;     /* was DE' */
  uint8_t  datum;           /* was A */
  uint8_t  major_delay;     /* was A */
  uint8_t  minor_delay;     /* was H */
  uint16_t channel0_index;  /* was HL */
  uint16_t channel1_index;  /* was HL' */
  uint8_t  speaker0;        /* was L */
  uint8_t  speaker1;        /* was L' */
  uint8_t  B;               /* was B */
  uint8_t  C;               /* was C */
  uint8_t  Bdash;           /* was B' */
  uint8_t  Cdash;           /* was C' */
  uint8_t  bit = 0; // most recently emitted bit

  assert(state != NULL);

  state->speccy->stamp(state->speccy);

  /* Conv: Menu driving loop was removed and the routine changed to return
   * non-zero when the game should begin. */
  menu_keys_state = check_menu_keys(state);
  if (menu_keys_state < 0 || menu_keys_state >= 2)
    return menu_keys_state; /* Start the game, or terminate the game thread */

  wave_morale_flag(state);

  /* Play music */

  channel0_index = state->music_channel0_index + 1;
  for (;;)
  {
    state->music_channel0_index = channel0_index;
    datum = music_channel0_data[channel0_index];
    if (datum != 0xFF) /* end marker */
      break;
    channel0_index = 0;
  }
  frequency_0 = counter_0 = frequency_for_semitone(datum, &speaker0);

  channel1_index = state->music_channel1_index + 1;
  for (;;)
  {
    state->music_channel1_index = channel1_index;
    datum = music_channel1_data[channel1_index];
    if (datum != 0xFF) /* end marker */
      break;
    channel1_index = 0;
  }
  frequency_1 = counter_1 = frequency_for_semitone(datum, &speaker1);

  /* When the second channel is silent use the first channel's frequency. */
  if ((counter_1 >> 8) == 0xFF) // (BCdash >> 8) was Bdash;
    frequency_1 = counter_1 = counter_0;

  major_delay = 24; /* overall tune speed (a delay: lower values are faster) */
  do
  {
    minor_delay = 255;
    do
    {
      int to_emit = 3; // Conv: Whatever we do always emit this many bits

      // B,C are a pair of counters? half pulse length?
      // B = lo, C = hi  (in this routine)

      B = counter_0 >> 8;
      C = counter_0 & 0xFF;
      if (--B == 0 && --C == 0)
      {
        speaker0 ^= port_MASK_EAR;
        bit = speaker0 & port_MASK_EAR;
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, speaker0);
        to_emit--;
        counter_0 = frequency_0;
      }
      else
      {
        counter_0 = (B << 8) | C;
      }

      Bdash = counter_1 >> 8;
      Cdash = counter_1 & 0xFF;
      if (--Bdash == 0 && --Cdash == 0)
      {
        speaker1 ^= port_MASK_EAR;
        bit = speaker1 & port_MASK_EAR;
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, speaker1);
        to_emit--;
        counter_1 = frequency_1;
      }
      else
      {
        counter_1 = (Bdash << 8) | Cdash;
      }

      /* Conv: We simulate the EAR port holding its level by adding extra
       * OUTs here. */
      // FIXME: The timing needs working out here: 3 OUTs per loop works,
      // but why?
      while (to_emit-- > 0)
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, bit);
    }
    while (--minor_delay);
  }
  while (--major_delay);

  /* Conv: Timing: Calibrated to original game. */
  if (state->speccy->sleep(state->speccy, 300365))
    return -1; /* Terminate the game thread */

  return 0; /* Don't start the game */
}